

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O2

Status __thiscall osqp::OsqpSolver::UpdateTimeLimit(OsqpSolver *this,double time_limit_new)

{
  c_int cVar1;
  AlphaNum *in_RCX;
  undefined8 *in_RSI;
  string_view message;
  string_view message_00;
  string_view message_01;
  string local_a0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  if ((OSQPWorkspace *)*in_RSI == (OSQPWorkspace *)0x0) {
    message_00._M_str = (char *)0x1e;
    message_00._M_len = (size_t)this;
    absl::FailedPreconditionError(message_00);
  }
  else if (0.0 <= time_limit_new) {
    cVar1 = osqp_update_time_limit((OSQPWorkspace *)*in_RSI,time_limit_new);
    if (cVar1 == 0) {
      (this->workspace_)._M_t.
      super___uniq_ptr_impl<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>._M_t.
      super__Tuple_impl<0UL,_osqp::OSQPWorkspaceHelper_*,_osqp::OsqpSolver::OsqpDeleter>.
      super__Head_base<0UL,_osqp::OSQPWorkspaceHelper_*,_false>._M_head_impl =
           (OSQPWorkspaceHelper *)0x1;
    }
    else {
      message_01._M_str = (char *)0x2b;
      message_01._M_len = (size_t)this;
      absl::UnknownError(message_01);
    }
  }
  else {
    local_50[0] = absl::NullSafeStringView("Invalid time_limit value: ");
    absl::AlphaNum::AlphaNum(&local_80,time_limit_new);
    absl::StrCat_abi_cxx11_(&local_a0,(absl *)local_50,&local_80,in_RCX);
    message._M_str = (char *)local_a0._M_string_length;
    message._M_len = (size_t)this;
    absl::InvalidArgumentError(message);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateTimeLimit(const double time_limit_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (time_limit_new < 0.0) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid time_limit value: ", time_limit_new));
  }
  if (osqp_update_time_limit(workspace_.get(), time_limit_new) != 0) {
    return absl::UnknownError("osqp_update_time_limit unexpectedly failed.");
  }
  return absl::OkStatus();
}